

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

void __thiscall booster::aio::buffer_impl<char_*>::add(buffer_impl<char_*> *this,char *p,size_t s)

{
  pointer *ppeVar1;
  iterator iVar2;
  size_t sVar3;
  entry tmp;
  entry local_28;
  
  if (s != 0) {
    if (this->size_ == 1) {
      iVar2._M_current =
           (this->vec_).
           super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->vec_).
          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<booster::aio::buffer_impl<char*>::entry,std::allocator<booster::aio::buffer_impl<char*>::entry>>
        ::_M_realloc_insert<booster::aio::buffer_impl<char*>::entry_const&>
                  ((vector<booster::aio::buffer_impl<char*>::entry,std::allocator<booster::aio::buffer_impl<char*>::entry>>
                    *)&this->vec_,iVar2,&this->entry_);
      }
      else {
        sVar3 = (this->entry_).size;
        (iVar2._M_current)->ptr = (this->entry_).ptr;
        (iVar2._M_current)->size = sVar3;
        ppeVar1 = &(this->vec_).
                   super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppeVar1 = *ppeVar1 + 1;
      }
    }
    else if (this->size_ == 0) {
      (this->entry_).ptr = p;
      (this->entry_).size = s;
      this->size_ = 1;
      return;
    }
    iVar2._M_current =
         (this->vec_).
         super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->vec_).
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_28.ptr = p;
      local_28.size = s;
      std::
      vector<booster::aio::buffer_impl<char*>::entry,std::allocator<booster::aio::buffer_impl<char*>::entry>>
      ::_M_realloc_insert<booster::aio::buffer_impl<char*>::entry_const&>
                ((vector<booster::aio::buffer_impl<char*>::entry,std::allocator<booster::aio::buffer_impl<char*>::entry>>
                  *)&this->vec_,iVar2,&local_28);
    }
    else {
      (iVar2._M_current)->ptr = p;
      (iVar2._M_current)->size = s;
      ppeVar1 = &(this->vec_).
                 super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppeVar1 = *ppeVar1 + 1;
    }
    this->size_ = (int)((ulong)((long)(this->vec_).
                                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->vec_).
                                     super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  }
  return;
}

Assistant:

void add(Pointer p,size_t s)
			{
				if(s==0)
					return;
				if(size_ == 0) {
					entry_.ptr = p;
					entry_.size = s;
					size_ = 1;
					return;
				}
				else if(size_ == 1) {
					vec_.push_back(entry_);
				}
				entry tmp = { p,s };
				vec_.push_back(tmp);
				size_ = vec_.size();
			}